

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O3

Var Js::JavascriptConversion::MethodCallToPrimitive<(Js::JavascriptHint)2>
              (RecyclableObject *value,ScriptContext *requestContext)

{
  ScriptContext *checkScriptContext;
  ThreadContext *this;
  code *pcVar1;
  anon_class_32_4_9fc97a1a implicitCall;
  bool bVar2;
  BOOL BVar3;
  Var pvVar4;
  JavascriptFunction *function;
  JavascriptString *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *this_00;
  PropertyRecord *pPVar7;
  int32 hCode;
  Type typeId;
  Var local_38;
  Var varMethod;
  
  checkScriptContext =
       (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
       ptr;
  local_38 = (Var)0x0;
  if ((((((requestContext->config).threadConfig)->m_ES6ToPrimitive != true) ||
       (bVar2 = JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(value), bVar2)
       ) || (BVar3 = JavascriptOperators::GetPropertyReference
                               (value,0x1a,&local_38,requestContext,(PropertyValueInfo *)0x0),
            BVar3 == 0)) || (BVar3 = JavascriptOperators::IsUndefinedOrNull(local_38), BVar3 != 0))
  {
    pvVar4 = OrdinaryToPrimitive<(Js::JavascriptHint)2>(value,requestContext);
    return pvVar4;
  }
  bVar2 = VarIs<Js::JavascriptFunction>(local_38);
  if (bVar2) {
    function = UnsafeVarTo<Js::JavascriptFunction>(local_38);
    pJVar5 = StringCache::GetNumberTypeDisplay
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    if (function == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x1f0,"(nullptr != exoticToPrim)","nullptr != exoticToPrim");
      if (!bVar2) goto LAB_00a93432;
      *puVar6 = 0;
    }
    this = requestContext->threadContext;
    implicitCall.threadContext = this;
    implicitCall.value = value;
    implicitCall.exoticToPrim = function;
    implicitCall.hintString = pJVar5;
    pvVar4 = ThreadContext::
             ExecuteImplicitCall<Js::JavascriptConversion::MethodCallToPrimitive<(Js::JavascriptHint)2>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda()_1_>
                       (this,(RecyclableObject *)function,ImplicitCall_ToPrimitive,implicitCall);
    if (pvVar4 == (Var)0x0) {
      if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0x1fe,"(threadContext->IsDisableImplicitCall())",
                                    "threadContext->IsDisableImplicitCall()");
        if (!bVar2) {
LAB_00a93432:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      goto LAB_00a933c5;
    }
    BVar3 = CrossSite::NeedMarshalVar(pvVar4,requestContext);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x202,"(!CrossSite::NeedMarshalVar(result, requestContext))",
                                  "!CrossSite::NeedMarshalVar(result, requestContext)");
      if (!bVar2) goto LAB_00a93432;
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(pvVar4);
    if (bVar2) {
      return pvVar4;
    }
    bVar2 = TaggedInt::Is(pvVar4);
    typeId = TypeIds_FirstNumberType;
    if ((!bVar2) && (typeId = TypeIds_Number, (ulong)pvVar4 >> 0x32 == 0)) {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00a93432;
        *puVar6 = 0;
      }
      typeId = ((this_00->type).ptr)->typeId;
      if ((0x57 < (int)typeId) && (BVar3 = RecyclableObject::IsExternal(this_00), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00a93432;
        *puVar6 = 0;
      }
    }
    BVar3 = JavascriptOperators::IsObjectType(typeId);
    if (BVar3 == 0) {
      return pvVar4;
    }
    pPVar7 = (PropertyRecord *)0x1153602;
    hCode = -0x7ff5ec37;
  }
  else {
    pPVar7 = ScriptContext::GetPropertyName(requestContext,0x1a);
    pPVar7 = pPVar7 + 1;
    hCode = -0x7ff5ec45;
  }
  JavascriptError::TryThrowTypeError(checkScriptContext,requestContext,hCode,(PCWSTR)pPVar7);
LAB_00a933c5:
  return (((requestContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
         ).nullValue.ptr;
}

Assistant:

Var JavascriptConversion::MethodCallToPrimitive(_In_ RecyclableObject* value, _In_ ScriptContext * requestContext)
    {
        Var result = nullptr;
        ScriptContext *const scriptContext = value->GetScriptContext();

        //7.3.9 GetMethod(V, P)
        //  The abstract operation GetMethod is used to get the value of a specific property of an ECMAScript language value when the value of the
        //  property is expected to be a function. The operation is called with arguments V and P where V is the ECMAScript language value, P is the
        //  property key. This abstract operation performs the following steps:
        //  1. Assert: IsPropertyKey(P) is true.
        //  2. Let func be ? GetV(V, P).
        //  3. If func is either undefined or null, return undefined.
        //  4. If IsCallable(func) is false, throw a TypeError exception.
        //  5. Return func.
        Var varMethod = nullptr;

        if (!requestContext->GetConfig()->IsES6ToPrimitiveEnabled()
            || JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(value)
            || !JavascriptOperators::GetPropertyReference(value, PropertyIds::_symbolToPrimitive, &varMethod, requestContext)
            || JavascriptOperators::IsUndefinedOrNull(varMethod))
        {
            return OrdinaryToPrimitive<hint>(value, requestContext);
        }
        if (!VarIs<JavascriptFunction>(varMethod))
        {
            // Don't error if we disabled implicit calls
            JavascriptError::TryThrowTypeError(scriptContext, requestContext, JSERR_Property_NeedFunction, requestContext->GetPropertyName(PropertyIds::_symbolToPrimitive)->GetBuffer());
            return requestContext->GetLibrary()->GetNull();
        }

        // Let exoticToPrim be GetMethod(input, @@toPrimitive).
        JavascriptFunction* exoticToPrim = UnsafeVarTo<JavascriptFunction>(varMethod);
        JavascriptString* hintString = nullptr;

        if (hint == JavascriptHint::HintString)
        {
            hintString = requestContext->GetLibrary()->GetStringTypeDisplayString();
        }
        else if (hint == JavascriptHint::HintNumber)
        {
            hintString = requestContext->GetLibrary()->GetNumberTypeDisplayString();
        }
        else
        {
            hintString = requestContext->GetPropertyString(PropertyIds::default_);
        }

        // If exoticToPrim is not undefined, then
        Assert(nullptr != exoticToPrim);
        ThreadContext * threadContext = requestContext->GetThreadContext();
        result = threadContext->ExecuteImplicitCall(exoticToPrim, ImplicitCall_ToPrimitive, [=]()->Js::Var
        {
            // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
            Assert(!ThreadContext::IsOnStack(value));

            // Let result be the result of calling the[[Call]] internal method of exoticToPrim, with input as thisArgument and(hint) as argumentsList.
            return CALL_FUNCTION(threadContext, exoticToPrim, CallInfo(CallFlags_Value, 2), value, hintString);
        });

        if (!result)
        {
            // There was an implicit call and implicit calls are disabled. This would typically cause a bailout.
            Assert(threadContext->IsDisableImplicitCall());
            return requestContext->GetLibrary()->GetNull();
        }

        Assert(!CrossSite::NeedMarshalVar(result, requestContext));
        // If result is an ECMAScript language value and Type(result) is not Object, then return result.
        if (TaggedInt::Is(result) || !JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(result)))
        {
            return result;
        }
        // Else, throw a TypeError exception.
        else
        {
            // Don't error if we disabled implicit calls
            JavascriptError::TryThrowTypeError(scriptContext, requestContext, JSERR_FunctionArgument_Invalid, _u("[Symbol.toPrimitive]"));
            return requestContext->GetLibrary()->GetNull();
        }
    }